

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O1

void * sighip_new(t_floatarg f)

{
  float fVar1;
  t_object *owner;
  t_symbol *s1;
  t_symbol *s2;
  undefined4 uVar2;
  float fVar3;
  
  owner = (t_object *)pd_new(sighip_class);
  s1 = gensym("float");
  s2 = gensym("ft1");
  inlet_new(owner,(t_pd *)owner,s1,s2);
  outlet_new(owner,&s_signal);
  *(undefined4 *)&owner[1].te_g.g_pd = 0x472c4400;
  *(undefined4 *)&owner[1].te_g.g_next = 0;
  uVar2 = 0;
  fVar3 = 0.0;
  if (0.0 <= f) {
    fVar3 = f;
  }
  fVar1 = (fVar3 * -6.28318) / 44100.0 + 1.0;
  *(float *)((long)&owner[1].te_g.g_pd + 4) = fVar3;
  *(float *)((long)&owner[1].te_g.g_next + 4) = fVar1;
  if ((fVar1 < 0.0) || (uVar2 = 0x3f800000, 1.0 < fVar1)) {
    *(undefined4 *)((long)&owner[1].te_g.g_next + 4) = uVar2;
  }
  *(undefined4 *)&owner[1].te_binbuf = 0;
  return owner;
}

Assistant:

static void *sighip_new(t_floatarg f)
{
    t_sighip *x = (t_sighip *)pd_new(sighip_class);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    outlet_new(&x->x_obj, &s_signal);
    x->x_sr = 44100;
    x->x_cspace.c_x = 0;
    sighip_ft1(x, f);
    x->x_f = 0;
    return (x);
}